

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O1

void __thiscall
SimpleBVH::BVH::leaf_callback(BVH *this,VectorMax3d *p,int f,VectorMax3d *np,double *sq_d)

{
  int iVar1;
  ulong uVar2;
  int *piVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  double *pdVar10;
  array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_3UL> local_88;
  
  if ((this->leafCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    local_88._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.m_storage.
    m_data.array[0]._0_4_ = f;
    (*(this->leafCallback)._M_invoker)((_Any_data *)&this->leafCallback,p,(int *)&local_88,np,sq_d);
    return;
  }
  lVar5 = (this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.
          m_cols;
  if (lVar5 == 3) {
    if (-1 < f) {
      lVar7 = (long)f;
      lVar5 = (this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      if (lVar7 < lVar5) {
        pdVar6 = (this->vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        uVar2 = (this->vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols;
        if ((long)uVar2 < 0 && pdVar6 != (double *)0x0) goto LAB_00119737;
        piVar3 = (this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        iVar1 = piVar3[lVar7];
        if ((-1 < iVar1) &&
           (lVar4 = (this->vertices).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_rows, iVar1 < lVar4)) {
          if (3 < uVar2) goto LAB_00119756;
          local_88._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
          m_storage.m_rows = uVar2;
          if (uVar2 != 0) {
            pdVar10 = pdVar6 + iVar1;
            uVar8 = 0;
            do {
              local_88._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
              m_storage.m_data.array[uVar8] = *pdVar10;
              uVar8 = uVar8 + 1;
              pdVar10 = pdVar10 + lVar4;
            } while (uVar2 != uVar8);
          }
          lVar9 = (long)piVar3[lVar5 + lVar7];
          if ((-1 < lVar9) && (lVar9 < lVar4)) {
            local_88._M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
            m_storage.m_rows = uVar2;
            if (uVar2 != 0) {
              pdVar10 = pdVar6 + lVar9;
              uVar8 = 0;
              do {
                local_88._M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_data.array[uVar8] = *pdVar10;
                uVar8 = uVar8 + 1;
                pdVar10 = pdVar10 + lVar4;
              } while (uVar2 != uVar8);
            }
            lVar5 = (long)piVar3[lVar5 * 2 + lVar7];
            if ((-1 < lVar5) && (lVar5 < lVar4)) {
              local_88._M_elems[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
              m_storage.m_rows = uVar2;
              if (uVar2 != 0) {
                pdVar6 = pdVar6 + lVar5;
                uVar8 = 0;
                do {
                  local_88._M_elems[2].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>
                  .m_storage.m_data.array[uVar8] = *pdVar6;
                  uVar8 = uVar8 + 1;
                  pdVar6 = pdVar6 + lVar4;
                } while (uVar2 != uVar8);
              }
              point_triangle_squared_distance(p,&local_88,np,sq_d);
              return;
            }
          }
        }
        goto LAB_00119718;
      }
    }
  }
  else {
    if (lVar5 != 2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                    ,0x22c,
                    "void SimpleBVH::BVH::leaf_callback(const VectorMax3d &, int, VectorMax3d &, double &) const"
                   );
    }
    if (-1 < f) {
      lVar7 = (long)f;
      lVar5 = (this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      if (lVar7 < lVar5) {
        pdVar6 = (this->vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        uVar2 = (this->vertices).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_cols;
        if ((long)uVar2 < 0 && pdVar6 != (double *)0x0) {
LAB_00119737:
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,
                        "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/MapBase.h"
                        ,0xb2,
                        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>, Level = 0]"
                       );
        }
        piVar3 = (this->faces).super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data;
        iVar1 = piVar3[lVar7];
        if ((-1 < iVar1) &&
           (lVar4 = (this->vertices).
                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                    m_rows, iVar1 < lVar4)) {
          if (3 < uVar2) {
LAB_00119756:
            local_88._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
            m_storage.m_rows = 0;
            __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                          ,
                          "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/PlainObjectBase.h"
                          ,0x115,
                          "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1, 0, 3, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1, 0, 3, 1>]"
                         );
          }
          local_88._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
          m_storage.m_rows = uVar2;
          if (uVar2 != 0) {
            pdVar10 = pdVar6 + iVar1;
            uVar8 = 0;
            do {
              local_88._M_elems[0].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
              m_storage.m_data.array[uVar8] = *pdVar10;
              uVar8 = uVar8 + 1;
              pdVar10 = pdVar10 + lVar4;
            } while (uVar2 != uVar8);
          }
          lVar5 = (long)piVar3[lVar5 + lVar7];
          if ((-1 < lVar5) && (lVar5 < lVar4)) {
            local_88._M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
            m_storage.m_rows = uVar2;
            if (uVar2 != 0) {
              pdVar6 = pdVar6 + lVar5;
              uVar8 = 0;
              do {
                local_88._M_elems[1].super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_>.
                m_storage.m_data.array[uVar8] = *pdVar6;
                uVar8 = uVar8 + 1;
                pdVar6 = pdVar6 + lVar4;
              } while (uVar2 != uVar8);
            }
            point_segment_squared_distance
                      (p,(array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *)&local_88,np,sq_d);
            return;
          }
        }
LAB_00119718:
        __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                      ,
                      "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/Block.h"
                      ,0x7a,
                      "Eigen::Block<const Eigen::Matrix<double, -1, -1>, 1>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                     );
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/root/.cache/CPM/eigen/9cb760a6fcc3143cbb7856ce4548b1cf4b385f2e/Eigen/src/Core/DenseCoeffsBase.h"
                ,0x77,
                "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<int, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<int, -1, -1>, Level = 0]"
               );
}

Assistant:

void BVH::leaf_callback(
    const VectorMax3d& p, int f, VectorMax3d& np, double& sq_d) const
{
    if (leafCallback) {
        leafCallback(p, f, np, sq_d);
        return;
    }

    if (faces.cols() == 2) {
        point_segment_squared_distance(
            p, { { vertices.row(faces(f, 0)), vertices.row(faces(f, 1)) } }, np,
            sq_d);
        return;
    } else if (faces.cols() == 3) {
        point_triangle_squared_distance(
            p,
            { { vertices.row(faces(f, 0)), vertices.row(faces(f, 1)),
                vertices.row(faces(f, 2)) } },
            np, sq_d);
        return;
    }

    assert(false);
}